

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::remove_web_seed_iter(torrent *this,iterator web)

{
  _List_node_base *p_Var1;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  bool in;
  undefined8 local_30;
  system_error_category *local_28;
  
  if (*(char *)((long)&web._M_node[0xb]._M_next + 1) == '\x01') {
    *(undefined1 *)((long)&web._M_node[0xb]._M_next + 2) = 1;
  }
  else {
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"removing web seed: \"%s\"",web._M_node[1]._M_next);
    p_Var1 = web._M_node[9]._M_next;
    if (p_Var1 != (_List_node_base *)0x0) {
      local_30 = 0x10000007d;
      local_28 = &boost::system::detail::cat_holder<void>::system_category_instance;
      (*(code *)p_Var1[-8]._M_next[10]._M_next)(p_Var1 + -8,&local_30,1,0);
      (*(code *)p_Var1[-8]._M_next[3]._M_next)(p_Var1 + -8,0);
    }
    this_00._M_head_impl =
         (this->super_torrent_hot_members).m_picker._M_t.
         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         ._M_t.
         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
    if (this_00._M_head_impl != (piece_picker *)0x0) {
      piece_picker::clear_peer(this_00._M_head_impl,(torrent_peer *)&web._M_node[8]._M_prev);
    }
    ::std::__cxx11::list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
    ::_M_erase(&this->m_web_seeds,web);
  }
  in = want_tick(this);
  update_list(this,(torrent_list_index_t)0x1,in);
  return;
}

Assistant:

void torrent::remove_web_seed_iter(std::list<web_seed_t>::iterator web)
	{
		if (web->resolving)
		{
			web->removed = true;
		}
		else
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("removing web seed: \"%s\"", web->url.c_str());
#endif

			auto* peer = static_cast<peer_connection*>(web->peer_info.connection);
			if (peer != nullptr)
			{
				// if we have a connection for this web seed, we also need to
				// disconnect it and clear its reference to the peer_info object
				// that's part of the web_seed_t we're about to remove
				TORRENT_ASSERT(peer->m_in_use == 1337);
				peer->disconnect(boost::asio::error::operation_aborted, operation_t::bittorrent);
				peer->set_peer_info(nullptr);
			}
			if (has_picker()) picker().clear_peer(&web->peer_info);

			m_web_seeds.erase(web);
		}

		update_want_tick();
	}